

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void __thiscall FIX::double_conversion::UInt128::Shift(UInt128 *this,int shift_amount)

{
  byte bVar1;
  int shift_amount_local;
  UInt128 *this_local;
  
  if (shift_amount < -0x40 || 0x40 < shift_amount) {
    __assert_fail("-64 <= shift_amount && shift_amount <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                  ,0x3c,"void FIX::double_conversion::UInt128::Shift(int)");
  }
  if (shift_amount != 0) {
    if (shift_amount == -0x40) {
      this->high_bits_ = this->low_bits_;
      this->low_bits_ = 0;
    }
    else if (shift_amount == 0x40) {
      this->low_bits_ = this->high_bits_;
      this->high_bits_ = 0;
    }
    else {
      bVar1 = (byte)shift_amount;
      if (shift_amount < 1) {
        this->high_bits_ = this->high_bits_ << (-bVar1 & 0x3f);
        this->high_bits_ = (this->low_bits_ >> (bVar1 + 0x40 & 0x3f)) + this->high_bits_;
        this->low_bits_ = this->low_bits_ << (-bVar1 & 0x3f);
      }
      else {
        this->low_bits_ = this->low_bits_ >> (bVar1 & 0x3f);
        this->low_bits_ = (this->high_bits_ << (0x40 - bVar1 & 0x3f)) + this->low_bits_;
        this->high_bits_ = this->high_bits_ >> (bVar1 & 0x3f);
      }
    }
  }
  return;
}

Assistant:

void Shift(int shift_amount) {
    ASSERT(-64 <= shift_amount && shift_amount <= 64);
    if (shift_amount == 0) {
      return;
    } else if (shift_amount == -64) {
      high_bits_ = low_bits_;
      low_bits_ = 0;
    } else if (shift_amount == 64) {
      low_bits_ = high_bits_;
      high_bits_ = 0;
    } else if (shift_amount <= 0) {
      high_bits_ <<= -shift_amount;
      high_bits_ += low_bits_ >> (64 + shift_amount);
      low_bits_ <<= -shift_amount;
    } else {
      low_bits_ >>= shift_amount;
      low_bits_ += high_bits_ << (64 - shift_amount);
      high_bits_ >>= shift_amount;
    }
  }